

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O1

void __thiscall OPLmusicFile::Restart(OPLmusicFile *this)

{
  musicBlock *this_00;
  BYTE BVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  int iVar4;
  
  this_00 = &(this->super_OPLmusicBlock).super_musicBlock;
  musicBlock::OPLstopMusic(this_00);
  musicBlock::OPLplayMusic(this_00,0x7f);
  (this->super_OPLmusicBlock).super_musicBlock.MLtime = 0;
  (this->super_OPLmusicBlock).super_musicBlock.playingcount = 0;
  (this->super_OPLmusicBlock).LastOffset = 0.0;
  this->WhichChip = 0;
  switch(this->RawPlayer) {
  case RDosPlay:
    pBVar2 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
    (this->super_OPLmusicBlock).super_musicBlock.score = pBVar2 + 10;
    (this->super_OPLmusicBlock).SamplesPerTick =
         (double)*(ushort *)(pBVar2 + 8) * 0.041666666666666664;
    break;
  case IMF:
    pBVar2 = (this->super_OPLmusicBlock).super_musicBlock.scoredata + 6;
    (this->super_OPLmusicBlock).super_musicBlock.score = pBVar2;
    iVar4 = 2;
    do {
      do {
        pBVar3 = pBVar2 + 1;
        this_00->score = pBVar3;
        BVar1 = *pBVar2;
        pBVar2 = pBVar3;
      } while (BVar1 != '\0');
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    pBVar2 = this_00->score;
    this_00->score = pBVar2 + 1;
    if (*(int *)(pBVar2 + 1) != 0) {
      this_00->score = pBVar2 + 5;
    }
    break;
  case DosBox1:
    pBVar2 = (this->super_OPLmusicBlock).super_musicBlock.scoredata + 0x18;
    goto LAB_00333cae;
  case DosBox2:
    pBVar2 = (this->super_OPLmusicBlock).super_musicBlock.scoredata;
    pBVar2 = pBVar2 + (ulong)pBVar2[0x19] + 0x1a;
LAB_00333cae:
    (this->super_OPLmusicBlock).super_musicBlock.score = pBVar2;
    (this->super_OPLmusicBlock).SamplesPerTick = 49.716;
  }
  (*((this->super_OPLmusicBlock).super_musicBlock.io)->_vptr_OPLio[5])
            ((this->super_OPLmusicBlock).SamplesPerTick);
  return;
}

Assistant:

void OPLmusicFile::Restart ()
{
	OPLmusicBlock::Restart();
	WhichChip = 0;
	switch (RawPlayer)
	{
	case RDosPlay:
		score = scoredata + 10;
		SamplesPerTick = LittleShort(*(WORD *)(scoredata + 8)) / ADLIB_CLOCK_MUL;
		break;

	case DosBox1:
		score = scoredata + 24;
		SamplesPerTick = OPL_SAMPLE_RATE / 1000;
		break;

	case DosBox2:
		score = scoredata + 0x1A + scoredata[0x19];
		SamplesPerTick = OPL_SAMPLE_RATE / 1000;
		break;

	case IMF:
		score = scoredata + 6;

		// Skip track and game name
		for (int i = 2; i != 0; --i)
		{
			while (*score++ != '\0') {}
		}
		score++;	// Skip unknown byte
		if (*(DWORD *)score != 0)
		{
			score += 4;		// Skip song length
		}
		break;
	}
	io->SetClockRate(SamplesPerTick);
}